

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_lambda.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseLambda(Parser *this)

{
  __uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> _Var1;
  long lVar2;
  Lexer *__args_1;
  long *plVar3;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> uVar4;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> uVar5;
  undefined1 auVar6 [8];
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  Parser *in_RSI;
  undefined1 local_c0 [8];
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> body;
  undefined1 local_a0 [8];
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  undefined1 local_80 [8];
  Exprs params;
  undefined1 local_48 [16];
  
  sanityExpect(in_RSI,TOK_KW_LAMBDA);
  params.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  params.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  params.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar8 = Token::operator==(in_RSI->lexer->currentToken,TOK_OP_BRACKET_OPEN);
  if (bVar8) {
    Lexer::next(in_RSI->lexer);
    parseExpression((Parser *)&body,(Precedence)in_RSI);
    if ((__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)
        body._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
        _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
        super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0) {
      bVar8 = true;
    }
    else {
      _Var1._M_t.
      super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
      super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
           (tuple<pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>)
           (tuple<pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>)body;
      while( true ) {
        body._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
        _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
        super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
             (__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true>
             )(__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true>
               )_Var1._M_t.
                super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl;
        bVar8 = isBiOpExpr((Expr *)body._M_t.
                                   super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                                   .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl,
                           TOK_OP_COMMA);
        uVar4 = body;
        if (!bVar8) break;
        if (*(undefined ***)
             body._M_t.
             super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
             super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
             super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl !=
            &PTR__BiOpExpr_0012b998) {
          __cxa_bad_cast();
        }
        local_98._0_8_ =
             *(undefined8 *)
              ((long)body._M_t.
                     super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                     .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl + 0x50);
        *(undefined8 *)
         ((long)body._M_t.
                super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
                _M_t.
                super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl + 0x50) = 0;
        std::
        vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ::_M_insert_rval(&params,(const_iterator)
                                 params.
                                 super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,(value_type *)local_98);
        if ((Lexer *)local_98._0_8_ != (Lexer *)0x0) {
          (*(*(_func_int ***)local_98._0_8_)[1])();
        }
        uVar5._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
        ._M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
        super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
             body._M_t.
             super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
             super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
             super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl;
        _Var1._M_t.
        super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
        super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
             ((__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
             ((long)uVar4._M_t.
                    super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                    .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl + 0x48))->_M_t;
        *(undefined8 *)
         ((long)uVar4._M_t.
                super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
                _M_t.
                super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl + 0x48) = 0;
        if ((__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)
            body._M_t.
            super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
            super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0) {
          lVar2 = *(long *)body._M_t.
                           super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                           .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl;
          body._M_t.
          super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
          super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
          super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
               (__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true>
                )(__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true>
                  )_Var1;
          (**(code **)(lVar2 + 8))
                    (uVar5._M_t.
                     super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                     .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl);
          _Var1._M_t.
          super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
          super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
               (tuple<pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>)
               (tuple<pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>)
               body._M_t.
               super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
               _M_t.
               super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
               super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl;
        }
      }
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::_M_insert_rval(&params,(const_iterator)
                               params.
                               super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,(value_type *)&body);
      bVar8 = false;
    }
    bVar9 = expect(in_RSI,TOK_BRACKET_CLOSE);
    if (!bVar9) {
      local_a0._0_2_ = 2;
      local_c0._0_2_ = RETURN;
      local_c0._2_2_ = NONE >> 0x10;
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)local_98,(SyntaxErrorCode *)local_a0,(Position *)local_c0);
      generateError((Parser *)&stack0xffffffffffffffc8,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 &stack0xffffffffffffffc8);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)local_98);
      bVar8 = true;
    }
    if ((__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)
        body._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
        _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
        super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0) {
      (**(code **)(*(long *)body._M_t.
                            super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                            .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl + 8))();
    }
  }
  else {
    bVar8 = false;
  }
  bVar9 = Token::operator==(in_RSI->lexer->currentToken,TOK_OP_ASG);
  if (!bVar9) {
    bVar9 = expect(in_RSI,TOK_EOL);
    if (!bVar9) {
      local_c0._0_2_ = CONTINUE;
      local_98._0_4_ = 0xf;
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&body,(SyntaxErrorCode *)local_c0,(Position *)local_98);
      generateError((Parser *)local_48,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_48);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)&body);
      bVar8 = true;
    }
    parseFunctionBody((Parser *)&body);
    uVar4 = body;
    bVar9 = expect(in_RSI,TOK_STMT);
    if (bVar9) {
      if ((__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)
          uVar4._M_t.
          super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
          super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
          super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0 || bVar8)
      goto LAB_00115898;
      std::
      make_unique<pfederc::LambdaExpr,pfederc::Lexer&,pfederc::Position_const&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                ((Lexer *)local_98,(Position *)in_RSI->lexer,
                 (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                  *)((long)body._M_t.
                           super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                           .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl + 0x20),
                 (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)&params);
      uVar7 = local_98._0_8_;
      local_98._0_8_ = (_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)0x0;
      this->lexer = (Lexer *)uVar7;
      std::unique_ptr<pfederc::LambdaExpr,_std::default_delete<pfederc::LambdaExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::LambdaExpr,_std::default_delete<pfederc::LambdaExpr>_> *)
                 local_98);
    }
    else {
      local_a0._0_2_ = 2;
      local_c0._0_2_ = 0xc;
      local_c0._2_2_ = NONE >> 0x10;
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)local_98,(SyntaxErrorCode *)local_a0,(Position *)local_c0);
      generateError((Parser *)&stack0xffffffffffffffb0,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 &stack0xffffffffffffffb0);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)local_98);
LAB_00115898:
      this->lexer = (Lexer *)0x0;
    }
    std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr(&body);
    goto LAB_00115916;
  }
  Lexer::next(in_RSI->lexer);
  parseExpression((Parser *)local_c0,(Precedence)in_RSI);
  lVar2 = CONCAT44(local_c0._4_4_,CONCAT22(local_c0._2_2_,local_c0._0_2_));
  if (lVar2 == 0) {
    local_a0._0_2_ = 2;
    local_98._0_4_ = 0x13;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&body,(SyntaxErrorCode *)local_a0,(Position *)local_98);
    generateError((Parser *)(local_48 + 8),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_48 + 8));
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&body);
LAB_00115901:
    this->lexer = (Lexer *)0x0;
  }
  else {
    if (bVar8) goto LAB_00115901;
    body._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t
    .super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
    super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
         *(__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true> *)
          &((__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
           (lVar2 + 0x20))->_M_t;
    __args_1 = in_RSI->lexer;
    local_88._M_p = (pointer)0x0;
    local_98._0_8_ = (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0;
    local_98._8_8_ = (_Base_ptr)0x0;
    std::
    make_unique<pfederc::BodyExpr,pfederc::Lexer&,pfederc::Position_const&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,pfederc::ReturnControlType>
              ((Lexer *)local_80,(Position *)__args_1,
               (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                *)(lVar2 + 0x20),
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_98,
               (ReturnControlType *)local_c0);
    std::
    make_unique<pfederc::LambdaExpr,pfederc::Lexer&,pfederc::Position&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
              ((Lexer *)local_a0,(Position *)__args_1,
               (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                *)&body,(unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
                        &params);
    auVar6 = local_a0;
    local_a0 = (undefined1  [8])0x0;
    this->lexer = (Lexer *)auVar6;
    std::unique_ptr<pfederc::LambdaExpr,_std::default_delete<pfederc::LambdaExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::LambdaExpr,_std::default_delete<pfederc::LambdaExpr>_> *)
               local_a0);
    std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_80);
    std::
    vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ::~vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
               *)local_98);
  }
  plVar3 = (long *)CONCAT44(local_c0._4_4_,CONCAT22(local_c0._2_2_,local_c0._0_2_));
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))();
  }
LAB_00115916:
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector(&params);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseLambda() noexcept {
  sanityExpect(TokenType::TOK_KW_LAMBDA);

  bool err = false;

  Exprs params;
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_BRACKET_OPEN) {
    lexer.next();

    std::unique_ptr<Expr> paramexpr(parseExpression());
    if (!paramexpr) {
      err = true;
    } else {
      while (isBiOpExpr(*paramexpr, TokenType::TOK_OP_COMMA)) {
        BiOpExpr& biopexpr = dynamic_cast<BiOpExpr&>(*paramexpr);
        params.insert(params.begin(), biopexpr.getRightPtr());
        paramexpr = biopexpr.getLeftPtr();
      }

      params.insert(params.begin(), std::move(paramexpr));
    }

    if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET, lexer.getCurrentToken()->getPosition()));
      err = true;
    }
  }

  if (*lexer.getCurrentToken() == TokenType::TOK_OP_ASG) {
    // *=* *expr*
    lexer.next(); // eat =

    std::unique_ptr<Expr> expr(parseExpression());
    if (!expr) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EXPR, lexer.getCurrentToken()->getPosition()));
      return nullptr;
    }

    if (err)
      return nullptr;

    Position pos(expr->getPosition());

    return std::make_unique<LambdaExpr>(lexer, pos,
      std::move(params), std::make_unique<BodyExpr>(lexer,
        expr->getPosition(),
        Exprs(), std::move(expr), ReturnControlType::RETURN));
  }
  // *newline* *body* *;*
  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  std::unique_ptr<BodyExpr> body(parseFunctionBody());
  if (!body)
    err = true;

  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  if (err)
    return nullptr;

  return std::make_unique<LambdaExpr>(lexer, body->getPosition(),
    std::move(params), std::move(body));
}